

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParsePHPCoverage.cxx
# Opt level: O3

bool __thiscall cmParsePHPCoverage::ReadFileInformation(cmParsePHPCoverage *this,istream *in)

{
  ulong __n;
  cmCTest *pcVar1;
  bool bVar2;
  size_t sVar3;
  char *__s;
  long *plVar4;
  ostream *poVar5;
  bool bVar6;
  istream *this_00;
  long lVar7;
  char c;
  char buf [4];
  string fileName;
  ostringstream cmCTestLog_msg;
  char local_1f5;
  short local_1f4;
  undefined1 local_1f2;
  string local_1f0;
  char local_1d0;
  undefined7 uStack_1cf;
  long local_1c0 [2];
  int local_1ac;
  undefined1 local_1a8 [376];
  
  this_00 = in;
  std::istream::read((char *)in,(long)&local_1f4);
  local_1f2 = 0;
  if (local_1f4 != 0x3a73) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"failed to read start of file info found: [",0x2a);
    sVar3 = strlen((char *)&local_1f4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(char *)&local_1f4,sVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]\n",2);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmParsePHPCoverage.cxx"
                 ,0x8c,local_1f0._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    return false;
  }
  local_1ac = 0;
  ReadInt((cmParsePHPCoverage *)this_00,in,&local_1ac);
  lVar7 = (long)local_1ac;
  __n = lVar7 + 2;
  __s = (char *)operator_new__(__n);
  memset(__s,0,__n);
  plVar4 = (long *)std::istream::get((char *)in);
  if (((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) == 0) &&
     (local_1f5 != '\"')) {
    bVar6 = false;
    goto LAB_00281347;
  }
  std::istream::read((char *)in,(long)__s);
  __s[lVar7] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,__s,(allocator<char> *)local_1a8);
  plVar4 = (long *)std::istream::get((char *)in);
  if (((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) == 0) &&
     (local_1f5 != '\"')) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"failed to read close quote\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"read [",6);
    local_1d0 = local_1f5;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1d0,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]\n",2);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmParsePHPCoverage.cxx"
                 ,0xa0,(char *)CONCAT71(uStack_1cf,local_1d0),false);
LAB_002812f1:
    if ((long *)CONCAT71(uStack_1cf,local_1d0) != local_1c0) {
      operator_delete((long *)CONCAT71(uStack_1cf,local_1d0),local_1c0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    bVar6 = false;
  }
  else {
    bVar2 = ReadCoverageArray(this,in,&local_1f0);
    bVar6 = true;
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"failed to read coverage array for file: ",0x28);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      pcVar1 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmParsePHPCoverage.cxx"
                   ,0xa6,(char *)CONCAT71(uStack_1cf,local_1d0),false);
      goto LAB_002812f1;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
LAB_00281347:
  operator_delete__(__s);
  return bVar6;
}

Assistant:

bool cmParsePHPCoverage::ReadFileInformation(std::istream& in)
{
  char buf[4];
  in.read(buf, 2);
  buf[2] = 0;
  if (strcmp(buf, "s:") != 0) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "failed to read start of file info found: [" << buf << "]\n");
    return false;
  }
  char c;
  int size = 0;
  if (this->ReadInt(in, size)) {
    size++; // add one for null termination
    auto s = cm::make_unique<char[]>(size + 1);
    // read open quote
    if (in.get(c) && c != '"') {
      return false;
    }
    // read the string data
    in.read(s.get(), size - 1);
    s[size - 1] = 0;
    std::string fileName = s.get();
    // read close quote
    if (in.get(c) && c != '"') {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "failed to read close quote\n"
                   << "read [" << c << "]\n");
      return false;
    }
    if (!this->ReadCoverageArray(in, fileName)) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "failed to read coverage array for file: " << fileName
                                                            << "\n");
      return false;
    }
    return true;
  }
  return false;
}